

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECUPort.cc
# Opt level: O1

Bytes * __thiscall
SSM::ECUPort::buildReadRequest
          (Bytes *__return_storage_ptr__,ECUPort *this,Observables *observables,bool continuous)

{
  void *pvVar1;
  vector<std::byte,std::allocator<std::byte>> *this_00;
  long lVar2;
  long lVar3;
  undefined7 in_register_00000009;
  char *pcVar4;
  array<std::byte,_3UL> *addr;
  undefined8 *puVar5;
  long lVar6;
  long lVar7;
  initializer_list<std::byte> __l;
  Bytes addresses;
  Bytes *request;
  allocator_type local_79;
  void *local_78;
  iterator iStack_70;
  byte *local_68;
  vector<std::byte,std::allocator<std::byte>> *local_60;
  undefined4 local_54;
  byte local_50;
  undefined1 uStack_4f;
  undefined1 uStack_4e;
  char cStack_4d;
  undefined1 uStack_4c;
  undefined1 uStack_4b;
  undefined2 uStack_4a;
  long local_48;
  long local_40;
  undefined8 *local_38;
  
  local_54 = (undefined4)CONCAT71(in_register_00000009,continuous);
  local_78 = (void *)0x0;
  iStack_70._M_current = (byte *)0x0;
  local_68 = (byte *)0x0;
  puVar5 = *(undefined8 **)observables;
  local_38 = *(undefined8 **)(observables + 8);
  local_60 = (vector<std::byte,std::allocator<std::byte>> *)__return_storage_ptr__;
  if (puVar5 != local_38) {
    do {
      (**(code **)(*(long *)*puVar5 + 0x10))(&local_50);
      lVar2 = local_48;
      lVar3 = CONCAT26(uStack_4a,
                       CONCAT15(uStack_4b,
                                CONCAT14(uStack_4c,
                                         CONCAT13(cStack_4d,
                                                  CONCAT12(uStack_4e,CONCAT11(uStack_4f,local_50))))
                               ));
      while (lVar7 = lVar3, lVar7 != lVar2) {
        lVar6 = 0;
        do {
          if (iStack_70._M_current == local_68) {
            std::vector<std::byte,std::allocator<std::byte>>::_M_realloc_insert<std::byte_const&>
                      ((vector<std::byte,std::allocator<std::byte>> *)&local_78,iStack_70,
                       (byte *)(lVar7 + lVar6));
          }
          else {
            *iStack_70._M_current = *(byte *)(lVar7 + lVar6);
            iStack_70._M_current = iStack_70._M_current + 1;
          }
          lVar6 = lVar6 + 1;
          lVar3 = lVar7 + 3;
        } while (lVar6 != 3);
      }
      pvVar1 = (void *)CONCAT26(uStack_4a,
                                CONCAT15(uStack_4b,
                                         CONCAT14(uStack_4c,
                                                  CONCAT13(cStack_4d,
                                                           CONCAT12(uStack_4e,
                                                                    CONCAT11(uStack_4f,local_50)))))
                               );
      if (pvVar1 != (void *)0x0) {
        operator_delete(pvVar1,local_40 - (long)pvVar1);
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != local_38);
  }
  this_00 = local_60;
  local_50 = 0x80;
  uStack_4f = 0x10;
  uStack_4e = 0xf0;
  cStack_4d = ((char)iStack_70._M_current - (char)local_78) + '\x02';
  uStack_4c = 0xa8;
  uStack_4b = (undefined1)local_54;
  __l._M_len = 6;
  __l._M_array = &local_50;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)local_60,__l,&local_79);
  std::vector<std::byte,std::allocator<std::byte>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,std::allocator<std::byte>>>>
            (this_00,*(undefined8 *)(this_00 + 8),local_78,iStack_70._M_current);
  local_50 = 0;
  for (pcVar4 = *(char **)this_00; pcVar4 != *(char **)(this_00 + 8); pcVar4 = pcVar4 + 1) {
    local_50 = local_50 + *pcVar4;
  }
  std::vector<std::byte,_std::allocator<std::byte>_>::emplace_back<std::byte>
            ((vector<std::byte,_std::allocator<std::byte>_> *)this_00,&local_50);
  if (local_78 != (void *)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  return (Bytes *)this_00;
}

Assistant:

Bytes ECUPort::buildReadRequest(const Observables& observables,
				  bool continuous) const
  {
    // Add all read addresses to a byte vector
    Bytes addresses;
    for(const auto& obs : observables)
      for(const auto& addr: obs->addresses())
	for(const auto& addr_byte: addr)
	  addresses.push_back(addr_byte);
    
    // Build the header of read request. Datasize is number of
    // addresses plus 2 since READ and CONTIN_RESP/SINGLE_RESP bytes
    // are to be included (not the checksum byte though)
    Bytes request = { HEADER, ECU, TOOL, Byte(addresses.size()+2), READ,
		      (continuous ? CONTIN_RESP : SINGLE_RESP) };
    
    // Attach the addresses to read
    request.insert(request.end(), addresses.begin(), addresses.end());

    // Add the checksum byte and return
    request.push_back(checksum(request));
    return request;
  }